

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O0

MarkReference * __thiscall DataBuffer::addReference(DataBuffer *this,ByteMark *mark)

{
  int iVar1;
  MarkReference *local_20;
  MarkReference *ref;
  ByteMark *mark_local;
  DataBuffer *this_local;
  
  ref = (MarkReference *)mark;
  mark_local = (ByteMark *)this;
  local_20 = (MarkReference *)operator_new(0x10);
  local_20->target = (ByteMark *)ref;
  iVar1 = writtenSize(this);
  local_20->pos = iVar1;
  List<MarkReference_*>::operator<<(&this->m_references,&local_20);
  writeDWord(this,-0x41103502);
  return local_20;
}

Assistant:

MarkReference* DataBuffer::addReference (ByteMark* mark)
{
	MarkReference* ref = new MarkReference;
	ref->target = mark;
	ref->pos = writtenSize();
	m_references << ref;

	// Write a dummy placeholder for the reference
	writeDWord (0xBEEFCAFE);

	return ref;
}